

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NNsCompare(void *data1,void *data2)

{
  int iVar1;
  xmlNs *ns2;
  xmlNs *ns1;
  
  if (data1 == data2) {
    return 0;
  }
  if (data1 != (void *)0x0) {
    if (data2 != (void *)0x0) {
      iVar1 = xmlStrcmp(*(xmlChar **)((long)data1 + 0x18),*(xmlChar **)((long)data2 + 0x18));
      return iVar1;
    }
    return 1;
  }
  return -1;
}

Assistant:

static int
xmlC14NNsCompare(const void *data1, const void *data2)
{
    const xmlNs *ns1 = data1;
    const xmlNs *ns2 = data2;
    if (ns1 == ns2)
        return (0);
    if (ns1 == NULL)
        return (-1);
    if (ns2 == NULL)
        return (1);

    return (xmlStrcmp(ns1->prefix, ns2->prefix));
}